

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O2

void __thiscall
amrex::FabArray<amrex::EBCellFlagFab>::FabArray
          (FabArray<amrex::EBCellFlagFab> *this,BoxArray *bxs,DistributionMapping *dm,int nvar,
          IntVect *ngrow,MFInfo *info,FabFactory<amrex::EBCellFlagFab> *factory)

{
  int iVar1;
  undefined4 extraout_var;
  vector<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_> *pvVar2;
  
  FabArrayBase::FabArrayBase(&this->super_FabArrayBase);
  (this->super_FabArrayBase)._vptr_FabArrayBase = (_func_int **)&PTR__FabArray_007d3050;
  iVar1 = (*factory->_vptr_FabFactory[5])(factory);
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::EBCellFlagFab>,_std::default_delete<amrex::FabFactory<amrex::EBCellFlagFab>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::EBCellFlagFab>_*,_std::default_delete<amrex::FabFactory<amrex::EBCellFlagFab>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::EBCellFlagFab>_*,_false>._M_head_impl =
       (FabFactory<amrex::EBCellFlagFab> *)CONCAT44(extraout_var,iVar1);
  (this->m_dallocator).m_arena = (Arena *)0x0;
  this->define_function_called = false;
  pvVar2 = &this->m_fabs_v;
  (this->m_fabs_v).
  super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fabs_v).
  super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fabs_v).
  super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_hp_arrays = (void *)0x0;
  (this->m_arrays).hp = (Array4<amrex::EBCellFlag> *)0x0;
  (this->m_const_arrays).hp = (Array4<const_amrex::EBCellFlag> *)0x0;
  (this->m_tags).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tags).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_tags).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_tags).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->shmem).n_values = 0;
  (this->shmem).n_points = 0;
  (this->fbd)._M_t.
  super___uniq_ptr_impl<amrex::FBData<amrex::EBCellFlagFab>,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FBData<amrex::EBCellFlagFab>_*,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>_>
  .super__Head_base<0UL,_amrex::FBData<amrex::EBCellFlagFab>_*,_false>._M_head_impl =
       (FBData<amrex::EBCellFlagFab> *)0x0;
  (this->pcd)._M_t.
  super___uniq_ptr_impl<amrex::PCData<amrex::EBCellFlagFab>,_std::default_delete<amrex::PCData<amrex::EBCellFlagFab>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::PCData<amrex::EBCellFlagFab>_*,_std::default_delete<amrex::PCData<amrex::EBCellFlagFab>_>_>
  .super__Head_base<0UL,_amrex::PCData<amrex::EBCellFlagFab>_*,_false>._M_head_impl =
       (PCData<amrex::EBCellFlagFab> *)0x0;
  (this->os_temp)._M_t.
  super___uniq_ptr_impl<amrex::FabArray<amrex::EBCellFlagFab>,_std::default_delete<amrex::FabArray<amrex::EBCellFlagFab>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabArray<amrex::EBCellFlagFab>_*,_std::default_delete<amrex::FabArray<amrex::EBCellFlagFab>_>_>
  .super__Head_base<0UL,_amrex::FabArray<amrex::EBCellFlagFab>_*,_false>._M_head_impl =
       (FabArray<amrex::EBCellFlagFab> *)0x0;
  FabArrayBase::FabArrayStats::recordBuild((FabArrayStats *)&FabArrayBase::m_FA_stats);
  (*(this->super_FabArrayBase)._vptr_FabArrayBase[3])
            (this,bxs,dm,(ulong)(uint)nvar,ngrow,info,
             (this->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::EBCellFlagFab>,_std::default_delete<amrex::FabFactory<amrex::EBCellFlagFab>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::EBCellFlagFab>_*,_std::default_delete<amrex::FabFactory<amrex::EBCellFlagFab>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::EBCellFlagFab>_*,_false>._M_head_impl,
             pvVar2);
  return;
}

Assistant:

FabArray<FAB>::FabArray (const BoxArray&            bxs,
                         const DistributionMapping& dm,
                         int                        nvar,
                         const IntVect&             ngrow,
                         const MFInfo&              info,
                         const FabFactory<FAB>&     factory)
    : m_factory(factory.clone()),
      shmem()
{
    m_FA_stats.recordBuild();
    define(bxs,dm,nvar,ngrow,info,*m_factory);
}